

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O1

string_t __thiscall
duckdb::BinaryHugeIntOperator::Operation<duckdb::hugeint_t,duckdb::string_t>
          (BinaryHugeIntOperator *this,hugeint_t input,Vector *result)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  uint uVar10;
  long lVar11;
  BinaryHugeIntOperator *pBVar12;
  StringVector *this_00;
  byte *pbVar13;
  uint64_t lower;
  BinaryHugeIntOperator *pBVar14;
  ulong uVar15;
  int64_t upper;
  Vector *vector;
  undefined1 *puVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 *puVar26;
  long lVar27;
  undefined1 *puVar28;
  long lVar29;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var30;
  long lVar31;
  undefined1 *puVar32;
  long lVar33;
  undefined1 *puVar34;
  long lVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  ulong uVar38;
  int iVar41;
  undefined1 auVar39 [16];
  int iVar42;
  undefined1 auVar40 [16];
  int iVar43;
  int iVar55;
  int iVar56;
  int iVar57;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  int iVar68;
  undefined1 auVar67 [16];
  int iVar69;
  undefined1 *puVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 *puVar78;
  long lVar79;
  string_t target;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 *local_28;
  long lStack_20;
  
  this_00 = (StringVector *)input.upper;
  pBVar14 = (BinaryHugeIntOperator *)input.lower;
  lVar11 = 0x3f;
  pBVar12 = pBVar14;
  if ((pBVar14 == (BinaryHugeIntOperator *)0x0) &&
     (lVar11 = 0x7f, pBVar12 = this, this == (BinaryHugeIntOperator *)0x0)) {
    lVar11 = 0x80;
  }
  else {
    uVar15 = (ulong)pBVar12 >> 1 | (ulong)pBVar12;
    uVar15 = uVar15 >> 2 | uVar15;
    uVar15 = uVar15 >> 4 | uVar15;
    uVar15 = uVar15 >> 8 | uVar15;
    uVar15 = uVar15 >> 0x10 | uVar15;
    lVar11 = lVar11 - *(long *)(&DAT_01f1d930 +
                               ((uVar15 >> 0x20 | uVar15) * 0x3f79d71b4cb0a89 >> 0x3a) * 8);
  }
  if (lVar11 == 0x80) {
    local_48 = (undefined1  [16])
               StringVector::EmptyString(this_00,(Vector *)&DAT_00000001,(idx_t)this_00);
    uVar10 = local_48._0_4_;
    puVar70 = local_48._8_8_;
    if (uVar10 < 0xd) {
      puVar70 = local_48 + 4;
    }
    *puVar70 = 0x30;
  }
  else {
    vector = (Vector *)(0x80 - lVar11);
    local_48 = (undefined1  [16])StringVector::EmptyString(this_00,vector,(idx_t)this_00);
    uVar10 = local_48._0_4_;
    pbVar13 = local_48._8_8_;
    if (uVar10 < 0xd) {
      pbVar13 = local_48 + 4;
    }
    if ((Vector *)0x40 < vector) {
      do {
        *pbVar13 = ((ulong)pBVar14 >> ((ulong)((int)vector - 1U & 0xff) & 0x3f) & 1) != 0 | 0x30;
        pbVar13 = pbVar13 + 1;
        vector = (Vector *)
                 ((long)&vector[-1].auxiliary.internal.
                         super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7);
      } while ((Vector *)0x40 < vector);
      vector = (Vector *)0x40;
    }
    if (vector != (Vector *)0x0) {
      iVar9 = (int)vector;
      puVar16 = (undefined1 *)
                ((long)&vector[-1].auxiliary.internal.
                        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 7);
      auVar36._8_4_ = iVar9;
      auVar36._0_8_ = vector;
      auVar36._12_4_ = (int)((ulong)vector >> 0x20);
      puVar70 = (undefined1 *)
                ((long)&vector[-1].auxiliary.internal.
                        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 2);
      lVar17 = auVar36._8_8_;
      lVar11 = lVar17 + -0xf;
      puVar26 = (undefined1 *)
                ((long)&vector[-1].auxiliary.internal.
                        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 4);
      lVar27 = lVar17 + -0xd;
      puVar28 = (undefined1 *)
                ((long)&vector[-1].auxiliary.internal.
                        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 6);
      lVar29 = lVar17 + -0xb;
      p_Var30 = &vector[-1].auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      lVar31 = lVar17 + -9;
      puVar32 = (undefined1 *)
                ((long)&vector[-1].auxiliary.internal.
                        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 2);
      lVar33 = lVar17 + -7;
      puVar34 = (undefined1 *)
                ((long)&vector[-1].auxiliary.internal.
                        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 4);
      lVar35 = lVar17 + -5;
      puVar78 = (undefined1 *)
                ((long)&vector[-1].auxiliary.internal.
                        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 6);
      lVar79 = lVar17 + -3;
      lVar17 = lVar17 + -1;
      local_38._8_4_ = (int)puVar16;
      local_38._0_8_ = puVar16;
      local_38._12_4_ = (int)((ulong)puVar16 >> 0x20);
      uVar15 = 0;
      do {
        auVar67._8_4_ = (int)uVar15;
        auVar67._0_8_ = uVar15;
        auVar67._12_4_ = (int)(uVar15 >> 0x20);
        auVar39 = local_38 ^ _DAT_01dd7b40;
        auVar36 = (auVar67 | _DAT_01dd7b30) ^ _DAT_01dd7b40;
        iVar68 = auVar39._0_4_;
        iVar43 = -(uint)(iVar68 < auVar36._0_4_);
        iVar69 = auVar39._4_4_;
        iVar55 = -(uint)(iVar69 < auVar36._4_4_);
        iVar41 = auVar39._8_4_;
        iVar56 = -(uint)(iVar41 < auVar36._8_4_);
        iVar42 = auVar39._12_4_;
        iVar57 = -(uint)(iVar42 < auVar36._12_4_);
        auVar71._4_4_ = iVar43;
        auVar71._0_4_ = iVar43;
        auVar71._8_4_ = iVar56;
        auVar71._12_4_ = iVar56;
        auVar63 = pshuflw(in_XMM12,auVar71,0xe8);
        auVar45._4_4_ = -(uint)(auVar36._4_4_ == iVar69);
        auVar45._12_4_ = -(uint)(auVar36._12_4_ == iVar42);
        auVar45._0_4_ = auVar45._4_4_;
        auVar45._8_4_ = auVar45._12_4_;
        auVar58 = pshuflw(in_XMM10,auVar45,0xe8);
        auVar37._4_4_ = iVar55;
        auVar37._0_4_ = iVar55;
        auVar37._8_4_ = iVar57;
        auVar37._12_4_ = iVar57;
        auVar36 = pshuflw(_DAT_01dd7b40,auVar37,0xe8);
        auVar39._8_4_ = 0xffffffff;
        auVar39._0_8_ = 0xffffffffffffffff;
        auVar39._12_4_ = 0xffffffff;
        auVar39 = (auVar36 | auVar58 & auVar63) ^ auVar39;
        auVar36 = packssdw(auVar39,auVar39);
        local_28 = puVar70;
        lStack_20 = lVar11;
        if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pbVar13[uVar15] =
               ((ulong)this >>
                ((ulong)((long)&vector[-1].auxiliary.internal.
                                super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi + 7) & 0x3f) & 1) != 0 | 0x30;
        }
        auVar37 = auVar45 & auVar71 | auVar37;
        auVar36 = packssdw(auVar37,auVar37);
        auVar58._8_4_ = 0xffffffff;
        auVar58._0_8_ = 0xffffffffffffffff;
        auVar58._12_4_ = 0xffffffff;
        auVar36 = packssdw(auVar36 ^ auVar58,auVar36 ^ auVar58);
        auVar36 = packsswb(auVar36,auVar36);
        if ((auVar36._0_4_ >> 8 & 1) != 0) {
          pbVar13[uVar15 + 1] = ((ulong)this >> (lVar17 - 1U & 0x3f) & 1) != 0 | 0x30;
        }
        auVar36 = (auVar67 | _DAT_01dd8ba0) ^ _DAT_01dd7b40;
        iVar43 = -(uint)(iVar68 < auVar36._0_4_);
        iVar56 = -(uint)(iVar69 < auVar36._4_4_);
        iVar55 = -(uint)(iVar41 < auVar36._8_4_);
        iVar57 = -(uint)(iVar42 < auVar36._12_4_);
        auVar44._4_4_ = iVar43;
        auVar44._0_4_ = iVar43;
        auVar44._8_4_ = iVar55;
        auVar44._12_4_ = iVar55;
        iVar43 = -(uint)(auVar36._4_4_ == iVar69);
        iVar55 = -(uint)(auVar36._12_4_ == iVar42);
        auVar72._4_4_ = iVar43;
        auVar72._0_4_ = iVar43;
        auVar72._8_4_ = iVar55;
        auVar72._12_4_ = iVar55;
        auVar64._4_4_ = iVar56;
        auVar64._0_4_ = iVar56;
        auVar64._8_4_ = iVar57;
        auVar64._12_4_ = iVar57;
        auVar36 = auVar72 & auVar44 | auVar64;
        auVar36 = packssdw(auVar36,auVar36);
        auVar63._8_4_ = 0xffffffff;
        auVar63._0_8_ = 0xffffffffffffffff;
        auVar63._12_4_ = 0xffffffff;
        auVar36 = packssdw(auVar36 ^ auVar63,auVar36 ^ auVar63);
        auVar36 = packsswb(auVar36,auVar36);
        if ((auVar36._0_4_ >> 0x10 & 1) != 0) {
          pbVar13[uVar15 + 2] = ((ulong)this >> ((ulong)(puVar78 + -1) & 0x3f) & 1) != 0 | 0x30;
        }
        auVar36 = pshufhw(auVar36,auVar44,0x84);
        auVar45 = pshufhw(auVar44,auVar72,0x84);
        auVar39 = pshufhw(auVar36,auVar64,0x84);
        auVar18._8_4_ = 0xffffffff;
        auVar18._0_8_ = 0xffffffffffffffff;
        auVar18._12_4_ = 0xffffffff;
        auVar18 = (auVar39 | auVar45 & auVar36) ^ auVar18;
        auVar36 = packssdw(auVar18,auVar18);
        auVar36 = packsswb(auVar36,auVar36);
        if ((auVar36._0_4_ >> 0x18 & 1) != 0) {
          pbVar13[uVar15 + 3] = ((ulong)this >> (lVar79 - 1U & 0x3f) & 1) != 0 | 0x30;
        }
        auVar36 = (auVar67 | _DAT_01dd8b90) ^ _DAT_01dd7b40;
        auVar59._0_4_ = -(uint)(iVar68 < auVar36._0_4_);
        auVar59._4_4_ = -(uint)(iVar69 < auVar36._4_4_);
        auVar59._8_4_ = -(uint)(iVar41 < auVar36._8_4_);
        auVar59._12_4_ = -(uint)(iVar42 < auVar36._12_4_);
        auVar73._4_4_ = auVar59._0_4_;
        auVar73._0_4_ = auVar59._0_4_;
        auVar73._8_4_ = auVar59._8_4_;
        auVar73._12_4_ = auVar59._8_4_;
        auVar45 = pshuflw(auVar64,auVar73,0xe8);
        auVar19._0_4_ = -(uint)(auVar36._0_4_ == iVar68);
        auVar19._4_4_ = -(uint)(auVar36._4_4_ == iVar69);
        auVar19._8_4_ = -(uint)(auVar36._8_4_ == iVar41);
        auVar19._12_4_ = -(uint)(auVar36._12_4_ == iVar42);
        auVar46._4_4_ = auVar19._4_4_;
        auVar46._0_4_ = auVar19._4_4_;
        auVar46._8_4_ = auVar19._12_4_;
        auVar46._12_4_ = auVar19._12_4_;
        auVar36 = pshuflw(auVar19,auVar46,0xe8);
        auVar47._4_4_ = auVar59._4_4_;
        auVar47._0_4_ = auVar59._4_4_;
        auVar47._8_4_ = auVar59._12_4_;
        auVar47._12_4_ = auVar59._12_4_;
        auVar39 = pshuflw(auVar59,auVar47,0xe8);
        auVar1._8_4_ = 0xffffffff;
        auVar1._0_8_ = 0xffffffffffffffff;
        auVar1._12_4_ = 0xffffffff;
        auVar36 = packssdw(auVar36 & auVar45,(auVar39 | auVar36 & auVar45) ^ auVar1);
        auVar36 = packsswb(auVar36,auVar36);
        if ((auVar36 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pbVar13[uVar15 + 4] = ((ulong)this >> ((ulong)(puVar34 + -1) & 0x3f) & 1) != 0 | 0x30;
        }
        auVar47 = auVar46 & auVar73 | auVar47;
        auVar39 = packssdw(auVar47,auVar47);
        auVar2._8_4_ = 0xffffffff;
        auVar2._0_8_ = 0xffffffffffffffff;
        auVar2._12_4_ = 0xffffffff;
        auVar36 = packssdw(auVar36,auVar39 ^ auVar2);
        auVar36 = packsswb(auVar36,auVar36);
        if ((auVar36._4_2_ >> 8 & 1) != 0) {
          pbVar13[uVar15 + 5] = ((ulong)this >> (lVar35 - 1U & 0x3f) & 1) != 0 | 0x30;
        }
        auVar36 = (auVar67 | _DAT_01dd8b80) ^ _DAT_01dd7b40;
        iVar43 = -(uint)(iVar68 < auVar36._0_4_);
        iVar56 = -(uint)(iVar69 < auVar36._4_4_);
        iVar55 = -(uint)(iVar41 < auVar36._8_4_);
        iVar57 = -(uint)(iVar42 < auVar36._12_4_);
        auVar48._4_4_ = iVar43;
        auVar48._0_4_ = iVar43;
        auVar48._8_4_ = iVar55;
        auVar48._12_4_ = iVar55;
        iVar43 = -(uint)(auVar36._4_4_ == iVar69);
        iVar55 = -(uint)(auVar36._12_4_ == iVar42);
        auVar65._4_4_ = iVar43;
        auVar65._0_4_ = iVar43;
        auVar65._8_4_ = iVar55;
        auVar65._12_4_ = iVar55;
        auVar74._4_4_ = iVar56;
        auVar74._0_4_ = iVar56;
        auVar74._8_4_ = iVar57;
        auVar74._12_4_ = iVar57;
        auVar36 = auVar65 & auVar48 | auVar74;
        auVar36 = packssdw(auVar36,auVar36);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar36 = packssdw(auVar36 ^ auVar3,auVar36 ^ auVar3);
        auVar36 = packsswb(auVar36,auVar36);
        if ((auVar36 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pbVar13[uVar15 + 6] = ((ulong)this >> ((ulong)(puVar32 + -1) & 0x3f) & 1) != 0 | 0x30;
        }
        auVar36 = pshufhw(auVar36,auVar48,0x84);
        auVar45 = pshufhw(auVar48,auVar65,0x84);
        auVar39 = pshufhw(auVar36,auVar74,0x84);
        auVar20._8_4_ = 0xffffffff;
        auVar20._0_8_ = 0xffffffffffffffff;
        auVar20._12_4_ = 0xffffffff;
        auVar20 = (auVar39 | auVar45 & auVar36) ^ auVar20;
        auVar36 = packssdw(auVar20,auVar20);
        auVar36 = packsswb(auVar36,auVar36);
        if ((auVar36._6_2_ >> 8 & 1) != 0) {
          pbVar13[uVar15 + 7] = ((ulong)this >> (lVar33 - 1U & 0x3f) & 1) != 0 | 0x30;
        }
        auVar36 = (auVar67 | _DAT_01dd8b70) ^ _DAT_01dd7b40;
        auVar60._0_4_ = -(uint)(iVar68 < auVar36._0_4_);
        auVar60._4_4_ = -(uint)(iVar69 < auVar36._4_4_);
        auVar60._8_4_ = -(uint)(iVar41 < auVar36._8_4_);
        auVar60._12_4_ = -(uint)(iVar42 < auVar36._12_4_);
        auVar75._4_4_ = auVar60._0_4_;
        auVar75._0_4_ = auVar60._0_4_;
        auVar75._8_4_ = auVar60._8_4_;
        auVar75._12_4_ = auVar60._8_4_;
        auVar45 = pshuflw(auVar65,auVar75,0xe8);
        auVar21._0_4_ = -(uint)(auVar36._0_4_ == iVar68);
        auVar21._4_4_ = -(uint)(auVar36._4_4_ == iVar69);
        auVar21._8_4_ = -(uint)(auVar36._8_4_ == iVar41);
        auVar21._12_4_ = -(uint)(auVar36._12_4_ == iVar42);
        auVar49._4_4_ = auVar21._4_4_;
        auVar49._0_4_ = auVar21._4_4_;
        auVar49._8_4_ = auVar21._12_4_;
        auVar49._12_4_ = auVar21._12_4_;
        auVar36 = pshuflw(auVar21,auVar49,0xe8);
        auVar50._4_4_ = auVar60._4_4_;
        auVar50._0_4_ = auVar60._4_4_;
        auVar50._8_4_ = auVar60._12_4_;
        auVar50._12_4_ = auVar60._12_4_;
        auVar39 = pshuflw(auVar60,auVar50,0xe8);
        auVar61._8_4_ = 0xffffffff;
        auVar61._0_8_ = 0xffffffffffffffff;
        auVar61._12_4_ = 0xffffffff;
        auVar61 = (auVar39 | auVar36 & auVar45) ^ auVar61;
        auVar39 = packssdw(auVar61,auVar61);
        auVar36 = packsswb(auVar36 & auVar45,auVar39);
        if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pbVar13[uVar15 + 8] =
               ((ulong)this >>
                ((ulong)((long)&((__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2> *)
                                (p_Var30 + -1))->_M_ptr + 7) & 0x3f) & 1) != 0 | 0x30;
        }
        auVar50 = auVar49 & auVar75 | auVar50;
        auVar39 = packssdw(auVar50,auVar50);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar39 = packssdw(auVar39 ^ auVar4,auVar39 ^ auVar4);
        auVar36 = packsswb(auVar36,auVar39);
        if ((auVar36._8_2_ >> 8 & 1) != 0) {
          pbVar13[uVar15 + 9] = ((ulong)this >> (lVar31 - 1U & 0x3f) & 1) != 0 | 0x30;
        }
        auVar36 = (auVar67 | _DAT_01dd8b60) ^ _DAT_01dd7b40;
        iVar43 = -(uint)(iVar68 < auVar36._0_4_);
        iVar56 = -(uint)(iVar69 < auVar36._4_4_);
        iVar55 = -(uint)(iVar41 < auVar36._8_4_);
        iVar57 = -(uint)(iVar42 < auVar36._12_4_);
        auVar51._4_4_ = iVar43;
        auVar51._0_4_ = iVar43;
        auVar51._8_4_ = iVar55;
        auVar51._12_4_ = iVar55;
        iVar43 = -(uint)(auVar36._4_4_ == iVar69);
        iVar55 = -(uint)(auVar36._12_4_ == iVar42);
        auVar66._4_4_ = iVar43;
        auVar66._0_4_ = iVar43;
        auVar66._8_4_ = iVar55;
        auVar66._12_4_ = iVar55;
        auVar76._4_4_ = iVar56;
        auVar76._0_4_ = iVar56;
        auVar76._8_4_ = iVar57;
        auVar76._12_4_ = iVar57;
        auVar36 = auVar66 & auVar51 | auVar76;
        auVar36 = packssdw(auVar36,auVar36);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar36 = packssdw(auVar36 ^ auVar5,auVar36 ^ auVar5);
        auVar36 = packsswb(auVar36,auVar36);
        if ((auVar36 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          pbVar13[uVar15 + 10] = ((ulong)this >> ((ulong)(puVar28 + -1) & 0x3f) & 1) != 0 | 0x30;
        }
        auVar36 = pshufhw(auVar36,auVar51,0x84);
        auVar45 = pshufhw(auVar51,auVar66,0x84);
        auVar39 = pshufhw(auVar36,auVar76,0x84);
        auVar22._8_4_ = 0xffffffff;
        auVar22._0_8_ = 0xffffffffffffffff;
        auVar22._12_4_ = 0xffffffff;
        auVar22 = (auVar39 | auVar45 & auVar36) ^ auVar22;
        auVar36 = packssdw(auVar22,auVar22);
        auVar36 = packsswb(auVar36,auVar36);
        if ((auVar36._10_2_ >> 8 & 1) != 0) {
          pbVar13[uVar15 + 0xb] = ((ulong)this >> (lVar29 - 1U & 0x3f) & 1) != 0 | 0x30;
        }
        auVar36 = (auVar67 | _DAT_01dd8b50) ^ _DAT_01dd7b40;
        auVar62._0_4_ = -(uint)(iVar68 < auVar36._0_4_);
        auVar62._4_4_ = -(uint)(iVar69 < auVar36._4_4_);
        auVar62._8_4_ = -(uint)(iVar41 < auVar36._8_4_);
        auVar62._12_4_ = -(uint)(iVar42 < auVar36._12_4_);
        auVar77._4_4_ = auVar62._0_4_;
        auVar77._0_4_ = auVar62._0_4_;
        auVar77._8_4_ = auVar62._8_4_;
        auVar77._12_4_ = auVar62._8_4_;
        auVar45 = pshuflw(auVar66,auVar77,0xe8);
        auVar23._0_4_ = -(uint)(auVar36._0_4_ == iVar68);
        auVar23._4_4_ = -(uint)(auVar36._4_4_ == iVar69);
        auVar23._8_4_ = -(uint)(auVar36._8_4_ == iVar41);
        auVar23._12_4_ = -(uint)(auVar36._12_4_ == iVar42);
        auVar52._4_4_ = auVar23._4_4_;
        auVar52._0_4_ = auVar23._4_4_;
        auVar52._8_4_ = auVar23._12_4_;
        auVar52._12_4_ = auVar23._12_4_;
        auVar36 = pshuflw(auVar23,auVar52,0xe8);
        auVar53._4_4_ = auVar62._4_4_;
        auVar53._0_4_ = auVar62._4_4_;
        auVar53._8_4_ = auVar62._12_4_;
        auVar53._12_4_ = auVar62._12_4_;
        auVar39 = pshuflw(auVar62,auVar53,0xe8);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar36 = packssdw(auVar36 & auVar45,(auVar39 | auVar36 & auVar45) ^ auVar6);
        auVar36 = packsswb(auVar36,auVar36);
        if ((auVar36 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pbVar13[uVar15 + 0xc] = ((ulong)this >> ((ulong)(puVar26 + -1) & 0x3f) & 1) != 0 | 0x30;
        }
        auVar53 = auVar52 & auVar77 | auVar53;
        auVar39 = packssdw(auVar53,auVar53);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar36 = packssdw(auVar36,auVar39 ^ auVar7);
        auVar36 = packsswb(auVar36,auVar36);
        if ((auVar36._12_2_ >> 8 & 1) != 0) {
          pbVar13[uVar15 + 0xd] = ((ulong)this >> (lVar27 - 1U & 0x3f) & 1) != 0 | 0x30;
        }
        lVar11 = lStack_20;
        puVar70 = local_28;
        uVar38 = lStack_20 - 1;
        auVar36 = (auVar67 | _DAT_01dd8b40) ^ _DAT_01dd7b40;
        auVar24._0_4_ = -(uint)(iVar68 < auVar36._0_4_);
        auVar24._4_4_ = -(uint)(iVar69 < auVar36._4_4_);
        auVar24._8_4_ = -(uint)(iVar41 < auVar36._8_4_);
        auVar24._12_4_ = -(uint)(iVar42 < auVar36._12_4_);
        auVar54._4_4_ = auVar24._0_4_;
        auVar54._0_4_ = auVar24._0_4_;
        auVar54._8_4_ = auVar24._8_4_;
        auVar54._12_4_ = auVar24._8_4_;
        iVar68 = -(uint)(auVar36._4_4_ == iVar69);
        iVar69 = -(uint)(auVar36._12_4_ == iVar42);
        auVar40._4_4_ = iVar68;
        auVar40._0_4_ = iVar68;
        auVar40._8_4_ = iVar69;
        auVar40._12_4_ = iVar69;
        in_XMM12._4_4_ = auVar24._4_4_;
        in_XMM12._0_4_ = auVar24._4_4_;
        in_XMM12._8_4_ = auVar24._12_4_;
        in_XMM12._12_4_ = auVar24._12_4_;
        in_XMM10 = auVar40 & auVar54 | in_XMM12;
        auVar36 = packssdw(auVar24,in_XMM10);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar36 = packssdw(auVar36 ^ auVar8,auVar36 ^ auVar8);
        auVar36 = packsswb(auVar36,auVar36);
        if ((auVar36 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pbVar13[uVar15 + 0xe] = ((ulong)this >> ((ulong)(local_28 + -1) & 0x3f) & 1) != 0 | 0x30;
        }
        auVar36 = pshufhw(auVar36,auVar54,0x84);
        auVar45 = pshufhw(auVar40,auVar40,0x84);
        auVar39 = pshufhw(auVar36,in_XMM12,0x84);
        auVar25._8_4_ = 0xffffffff;
        auVar25._0_8_ = 0xffffffffffffffff;
        auVar25._12_4_ = 0xffffffff;
        auVar25 = (auVar39 | auVar45 & auVar36) ^ auVar25;
        auVar36 = packssdw(auVar25,auVar25);
        auVar36 = packsswb(auVar36,auVar36);
        if ((auVar36._14_2_ >> 8 & 1) != 0) {
          pbVar13[uVar15 + 0xf] = ((ulong)this >> (uVar38 & 0x3f) & 1) != 0 | 0x30;
        }
        uVar15 = uVar15 + 0x10;
        vector = (Vector *)&vector[-1].auxiliary;
        lVar17 = lVar17 + -0x10;
        puVar78 = puVar78 + -0x10;
        lVar79 = lVar79 + -0x10;
        puVar34 = puVar34 + -0x10;
        lVar35 = lVar35 + -0x10;
        puVar32 = puVar32 + -0x10;
        lVar33 = lVar33 + -0x10;
        p_Var30 = p_Var30 + -2;
        lVar31 = lVar31 + -0x10;
        puVar28 = puVar28 + -0x10;
        lVar29 = lVar29 + -0x10;
        puVar26 = puVar26 + -0x10;
        lVar27 = lVar27 + -0x10;
        puVar70 = puVar70 + -0x10;
        lVar11 = lVar11 + -0x10;
      } while ((iVar9 + 0xfU & 0xf0) != uVar15);
    }
  }
  uVar15 = (ulong)uVar10;
  if (uVar15 < 0xd) {
    switchD_01306cb1::default(local_48 + uVar15 + 4,0,0xc - uVar15);
  }
  else {
    local_48._4_4_ = *(undefined4 *)local_48._8_8_;
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_48;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto num_leading_zero = CountZeros<hugeint_t>::Leading(UnsafeNumericCast<hugeint_t>(input));
		idx_t buffer_size = sizeof(INPUT_TYPE) * 8 - num_leading_zero;

		// Special case: All bits are zero
		if (buffer_size == 0) {
			auto target = StringVector::EmptyString(result, 1);
			auto output = target.GetDataWriteable();
			*output = '0';
			target.Finalize();
			return target;
		}

		auto target = StringVector::EmptyString(result, buffer_size);
		auto output = target.GetDataWriteable();

		WriteHugeIntBinBytes<hugeint_t>(input, output, buffer_size);

		target.Finalize();
		return target;
	}